

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O2

void av1_free_shared_coeff_buffer(PC_TREE_SHARED_BUFFERS *shared_bufs)

{
  long lVar1;
  
  for (lVar1 = -0x18; lVar1 != 0; lVar1 = lVar1 + 8) {
    aom_free(*(void **)((long)shared_bufs->qcoeff_buf + lVar1));
    aom_free(*(void **)((long)shared_bufs->dqcoeff_buf + lVar1));
    aom_free(*(void **)((long)shared_bufs[1].coeff_buf + lVar1));
    *(undefined8 *)((long)shared_bufs->qcoeff_buf + lVar1) = 0;
    *(undefined8 *)((long)shared_bufs->dqcoeff_buf + lVar1) = 0;
    *(undefined8 *)((long)shared_bufs[1].coeff_buf + lVar1) = 0;
  }
  return;
}

Assistant:

void av1_free_shared_coeff_buffer(PC_TREE_SHARED_BUFFERS *shared_bufs) {
  for (int i = 0; i < 3; i++) {
    aom_free(shared_bufs->coeff_buf[i]);
    aom_free(shared_bufs->qcoeff_buf[i]);
    aom_free(shared_bufs->dqcoeff_buf[i]);
    shared_bufs->coeff_buf[i] = NULL;
    shared_bufs->qcoeff_buf[i] = NULL;
    shared_bufs->dqcoeff_buf[i] = NULL;
  }
}